

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method_property.cpp
# Opt level: O3

void __thiscall
MethodProperty_SetFromProperty_Test::TestBody(MethodProperty_SetFromProperty_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>
  *this_00;
  undefined1 *puVar3;
  MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue>,_prop::ReadOnly,_2UL,_void>
  *uref;
  bool bVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  BasicMethodProperties obj;
  BasicMethodProperties obj2;
  AssertHelper local_178;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [128];
  MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string_const&,&(BasicMethodProperties::getStringValue2CRef()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string_const&,&BasicMethodProperties::setStringValue2CRef>,8ul,prop::ReadWrite>
  local_c0;
  MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2_()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string&&,&BasicMethodProperties::setStringValue2RVRef>,9ul,prop::ReadWrite>
  local_bf;
  MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder,&(BasicMethodProperties::getStringHolder()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder,&BasicMethodProperties::setStringHolder>,10ul,prop::ReadWrite>
  local_be;
  MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder_const&,&(BasicMethodProperties::getStringHolderCRef()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder_const&,&BasicMethodProperties::setStringHolderCRef>,11ul,prop::ReadWrite>
  local_bd;
  MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder,&(BasicMethodProperties::getStringHolder_()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder&&,&BasicMethodProperties::setStringHolderRVRef>,12ul,prop::ReadWrite>
  local_bc [4];
  undefined1 local_b8 [127];
  MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue2>,_prop::detail::SetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::setStringValue2>,_7UL,_prop::ReadWrite>
  local_39;
  MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::getStringValue2CRef>,_prop::detail::SetterWrapper<BasicMethodProperties,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&BasicMethodProperties::setStringValue2CRef>,_8UL,_prop::ReadWrite>
  local_38 [8];
  
  local_140._8_8_ = local_140 + 0x18;
  local_140._0_4_ = 0;
  local_140._16_8_ = 0;
  local_140[0x18] = '\0';
  local_140._40_4_ = 0;
  local_140._48_8_ = local_140 + 0x40;
  local_140._56_8_ = 0;
  local_140[0x40] = '\0';
  local_140._80_8_ = local_140 + 0x60;
  local_140._88_8_ = 0;
  local_140[0x60] = '\0';
  local_140._112_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  local_b8._8_8_ = local_b8 + 0x18;
  local_b8._0_4_ = 0;
  local_b8._16_8_ = (char *)0x0;
  local_b8[0x18] = '\0';
  local_b8._40_4_ = 0;
  local_b8._48_8_ = local_b8 + 0x40;
  local_b8._56_8_ = (char *)0x0;
  local_b8[0x40] = '\0';
  local_b8._80_8_ = local_b8 + 0x60;
  local_b8._88_8_ = 0;
  local_b8[0x60] = '\0';
  local_b8._112_8_ = 0;
  paVar1 = &local_160.field_2;
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_160,local_140._48_8_);
  pcVar5 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_170,"\"\"","obj.string_value()",(char (*) [1])0x1490ea,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_170.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_168.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x245,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_170.ptr_._4_4_ << 0x20);
  local_178.data_._0_4_ = local_140._40_4_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_160,"0","obj.int_value()",(int *)&local_170,(int *)&local_178);
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_170);
    if ((undefined8 *)local_160._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x246,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_170.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_170.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_170.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_160._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_140._48_8_,(pointer)(local_140._48_8_ + local_140._56_8_));
  pcVar5 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_170,"\"\"","obj.string_value2()",(char (*) [1])0x1490ea,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_170.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_168.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x247,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170.ptr_ = local_170.ptr_ & 0xffffffff00000000;
  local_178.data_._0_4_ = local_140._40_4_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_160,"0","obj.int_value2()",(int *)&local_170,(int *)&local_178);
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_170);
    if ((undefined8 *)local_160._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x248,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_170.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_170.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_170.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_160._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_140._48_8_,(pointer)(local_140._48_8_ + local_140._56_8_));
  pcVar5 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_170,"\"\"","obj.string_value3()",(char (*) [1])0x1490ea,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_170.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_168.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x249,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170.ptr_ = local_170.ptr_ & 0xffffffff00000000;
  local_178.data_._0_4_ = local_140._40_4_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_160,"0","obj.int_value3()",(int *)&local_170,(int *)&local_178);
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_170);
    if ((undefined8 *)local_160._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x24a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_170.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_170.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_170.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_160._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178.data_._0_4_ = 0;
  local_170.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._112_8_;
  testing::internal::CmpHelperEQ<int,long_long>
            ((internal *)&local_160,"0","obj.long_value()",(int *)&local_178,(longlong *)&local_170)
  ;
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_170);
    if ((undefined8 *)local_160._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x24b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_170.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_170.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_170.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_160._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  puVar2 = local_b8 + 0x30;
  local_b8._40_4_ = 0x41;
  std::__cxx11::string::_M_replace((ulong)puVar2,0,(char *)local_b8._56_8_,0x14623a);
  this_00 = (MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>
             *)(local_140 + 0x7f);
  prop::
  MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>
  ::
  set<prop::MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>&>
            (this_00,&local_39);
  local_140._40_4_ = local_b8._40_4_;
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_140._48_8_,(pointer)(local_140._48_8_ + local_140._56_8_));
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_170,"\"bob\"","obj.string_value()",(char (*) [4])"bob",&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_170.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_168.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x251,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170.ptr_._0_4_ = 0x41;
  local_178.data_._0_4_ = local_140._40_4_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_160,"65","obj.int_value()",(int *)&local_170,(int *)&local_178);
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_170);
    if ((undefined8 *)local_160._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x252,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_170.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_170.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_170.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_160._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._40_4_ = 0x17;
  std::__cxx11::string::_M_replace((ulong)puVar2,0,(char *)local_b8._56_8_,0x14623e);
  prop::
  MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>
  ::
  set<prop::MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string_const&,&(BasicMethodProperties::getStringValue2CRef()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string_const&,&BasicMethodProperties::setStringValue2CRef>,8ul,prop::ReadWrite>&>
            (this_00,local_38);
  local_140._40_4_ = local_b8._40_4_;
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_140._48_8_,(pointer)(local_140._48_8_ + local_140._56_8_));
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_170,"\"bill\"","obj.string_value()",(char (*) [5])"bill",&local_160)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_170.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_168.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,600,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170.ptr_._0_4_ = 0x17;
  local_178.data_._0_4_ = local_140._40_4_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_160,"23","obj.int_value()",(int *)&local_170,(int *)&local_178);
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_170);
    if ((undefined8 *)local_160._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x259,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_170.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_170.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_170.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_160._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  puVar3 = local_b8 + 8;
  local_b8._0_4_ = 0x48;
  std::__cxx11::string::_M_replace((ulong)puVar3,0,(char *)local_b8._16_8_,0x1462ed);
  uref = (MethodProperty<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prop::detail::GetterWrapper<BasicMethodProperties,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&BasicMethodProperties::getStringValue>,_prop::ReadOnly,_2UL,_void>
          *)(local_b8 + 0x7a);
  prop::
  MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>
  ::
  set<prop::MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue()const)>,prop::ReadOnly,2ul,void>&>
            (this_00,uref);
  local_140._40_4_ = local_b8._0_4_;
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_140._48_8_,(pointer)(local_140._48_8_ + local_140._56_8_));
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_170,"\"john\"","obj.string_value()",(char (*) [5])"john",&local_160)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_170.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_168.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x25f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170.ptr_._0_4_ = 0x48;
  local_178.data_._0_4_ = local_140._40_4_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_160,"72","obj.int_value()",(int *)&local_170,(int *)&local_178);
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_170);
    if ((undefined8 *)local_160._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x260,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_170.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_170.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_170.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_160._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._0_4_ = 0xe;
  std::__cxx11::string::_M_replace((ulong)puVar3,0,(char *)local_b8._16_8_,0x146353);
  prop::
  MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string_const&,&(BasicMethodProperties::getStringValue2CRef()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string_const&,&BasicMethodProperties::setStringValue2CRef>,8ul,prop::ReadWrite>
  ::
  set<prop::MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue()const)>,prop::ReadOnly,2ul,void>&>
            (&local_c0,uref);
  local_140._40_4_ = local_b8._0_4_;
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_140._48_8_,(pointer)(local_140._48_8_ + local_140._56_8_));
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_170,"\"kate\"","obj.string_value2()",(char (*) [5])"kate",&local_160
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_170.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_168.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x266,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170.ptr_._0_4_ = 0xe;
  local_178.data_._0_4_ = local_140._40_4_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_160,"14","obj.int_value2()",(int *)&local_170,(int *)&local_178);
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_170);
    if ((undefined8 *)local_160._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x267,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_170.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_170.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_170.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_160._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._0_4_ = 0x61;
  std::__cxx11::string::_M_replace((ulong)puVar3,0,(char *)local_b8._16_8_,0x1463c4);
  prop::
  MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2_()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string&&,&BasicMethodProperties::setStringValue2RVRef>,9ul,prop::ReadWrite>
  ::
  set<prop::MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue()const)>,prop::ReadOnly,2ul,void>&>
            (&local_bf,uref);
  local_140._40_4_ = local_b8._0_4_;
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_140._48_8_,(pointer)(local_140._48_8_ + local_140._56_8_));
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_170,"\"jane\"","obj.string_value3()",(char (*) [5])"jane",&local_160
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_170.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_168.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x26d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170.ptr_._0_4_ = 0x61;
  local_178.data_._0_4_ = local_140._40_4_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_160,"97","obj.int_value3()",(int *)&local_170,(int *)&local_178);
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_170);
    if ((undefined8 *)local_160._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x26e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_170.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_170.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_170.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_160._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._40_4_ = 0x13;
  std::__cxx11::string::_M_replace((ulong)puVar2,0,(char *)local_b8._56_8_,0x147065);
  prop::
  MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder,&(BasicMethodProperties::getStringHolder()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder,&BasicMethodProperties::setStringHolder>,10ul,prop::ReadWrite>
  ::
  set<prop::MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>&>
            (&local_be,&local_39);
  local_140._112_8_ = SEXT48((int)local_b8._40_4_);
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_140._80_8_,(pointer)(local_140._80_8_ + local_140._88_8_));
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_170,"\"greg\"","obj.string_holder().string",(char (*) [5])"greg",
             &local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_170.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_168.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x274,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178.data_._0_4_ = 0x13;
  local_170.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._112_8_;
  testing::internal::CmpHelperEQ<int,long_long>
            ((internal *)&local_160,"19","obj.long_value()",(int *)&local_178,(longlong *)&local_170
            );
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_170);
    if ((undefined8 *)local_160._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x275,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_170.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_170.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_170.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_160._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._0_4_ = 0x33;
  std::__cxx11::string::_M_replace((ulong)puVar3,0,(char *)local_b8._16_8_,0x1470be);
  prop::
  MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder,&(BasicMethodProperties::getStringHolder()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder,&BasicMethodProperties::setStringHolder>,10ul,prop::ReadWrite>
  ::
  set<prop::MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue()const)>,prop::ReadOnly,2ul,void>&>
            (&local_be,uref);
  local_140._112_8_ = SEXT48((int)local_b8._0_4_);
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_140._80_8_,(pointer)(local_140._80_8_ + local_140._88_8_));
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_170,"\"phill\"","obj.string_holder().string",(char (*) [6])"phill",
             &local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_170.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_168.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x27b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178.data_._0_4_ = 0x33;
  local_170.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._112_8_;
  testing::internal::CmpHelperEQ<int,long_long>
            ((internal *)&local_160,"51","obj.long_value()",(int *)&local_178,(longlong *)&local_170
            );
  if ((char)local_160._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_170);
    if ((undefined8 *)local_160._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_160._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x27c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if (local_170.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_170.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_170.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_160._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::string::_M_replace((ulong)puVar2,0,(char *)local_b8._56_8_,0x1470cf);
  prop::
  MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder_const&,&(BasicMethodProperties::getStringHolderCRef()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder_const&,&BasicMethodProperties::setStringHolderCRef>,11ul,prop::ReadWrite>
  ::
  set<prop::MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>&>
            (&local_bd,&local_39);
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_140._80_8_,(pointer)(local_140._80_8_ + local_140._88_8_));
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_170,"\"matt\"","obj.string_holder().string",(char (*) [5])"matt",
             &local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_170.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_168.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x280,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::string::_M_replace((ulong)puVar2,0,(char *)local_b8._56_8_,0x1470db);
  prop::
  MethodProperty<BasicMethodProperties,StringHolder,prop::detail::GetterWrapper<BasicMethodProperties,StringHolder,&(BasicMethodProperties::getStringHolder_()const)>,prop::detail::SetterWrapper<BasicMethodProperties,StringHolder&&,&BasicMethodProperties::setStringHolderRVRef>,12ul,prop::ReadWrite>
  ::
  set<prop::MethodProperty<BasicMethodProperties,std::__cxx11::string,prop::detail::GetterWrapper<BasicMethodProperties,std::__cxx11::string,&(BasicMethodProperties::getStringValue2()const)>,prop::detail::SetterWrapper<BasicMethodProperties,std::__cxx11::string,&BasicMethodProperties::setStringValue2>,7ul,prop::ReadWrite>&>
            (local_bc,&local_39);
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_140._80_8_,(pointer)(local_140._80_8_ + local_140._88_8_));
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_170,"\"sam\"","obj.string_holder().string",(char (*) [4])"sam",
             &local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_170.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_168.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_168.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/method_property.cpp"
               ,0x284,pcVar5);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BasicMethodProperties::~BasicMethodProperties((BasicMethodProperties *)local_b8);
  BasicMethodProperties::~BasicMethodProperties((BasicMethodProperties *)local_140);
  return;
}

Assistant:

TEST(MethodProperty, SetFromProperty)
{
  BasicMethodProperties obj;
  BasicMethodProperties obj2;

  EXPECT_EQ( "", obj.string_value() );
  EXPECT_EQ( 0, obj.int_value() );
  EXPECT_EQ( "", obj.string_value2() );
  EXPECT_EQ( 0, obj.int_value2() );
  EXPECT_EQ( "", obj.string_value3() );
  EXPECT_EQ( 0, obj.int_value3() );
  EXPECT_EQ( 0, obj.long_value() );

  obj2.getIntValue2Test() = 65;
  obj2.getStringValue2Test() = "bob";
  obj.string_value = obj2.string_value;
  obj.int_value = obj2.int_value;
  EXPECT_EQ( "bob", obj.string_value() );
  EXPECT_EQ( 65, obj.int_value() );
  
  obj2.getIntValue2Test() = 23;
  obj2.getStringValue2Test() = "bill";
  obj.string_value = obj2.string_value2;
  obj.int_value = obj2.int_value2;
  EXPECT_EQ( "bill", obj.string_value() );
  EXPECT_EQ( 23, obj.int_value() );
  
  obj2.getIntValueTest() = 72;
  obj2.getStringValueTest() = "john";
  obj.string_value = obj2.ro_string_value;
  obj.int_value = obj2.ro_int_value;
  EXPECT_EQ( "john", obj.string_value() );
  EXPECT_EQ( 72, obj.int_value() );
  
  obj2.getIntValueTest() = 14;
  obj2.getStringValueTest() = "kate";
  obj.string_value2 = obj2.ro_string_value;
  obj.int_value2 = obj2.ro_int_value;
  EXPECT_EQ( "kate", obj.string_value2() );
  EXPECT_EQ( 14, obj.int_value2() );
  
  obj2.getIntValueTest() = 97;
  obj2.getStringValueTest() = "jane";
  obj.string_value3 = obj2.ro_string_value;
  obj.int_value3 = obj2.ro_int_value;
  EXPECT_EQ( "jane", obj.string_value3() );
  EXPECT_EQ( 97, obj.int_value3() );
  
  obj2.getIntValue2Test() = 19;
  obj2.getStringValue2Test() = "greg";
  obj.string_holder = obj2.string_value;
  obj.long_value = obj2.int_value;
  EXPECT_EQ( "greg", obj.string_holder().string );
  EXPECT_EQ( 19, obj.long_value() );
  
  obj2.getIntValueTest() = 51;
  obj2.getStringValueTest() = "phill";
  obj.string_holder = obj2.ro_string_value;
  obj.long_value = obj2.ro_int_value;
  EXPECT_EQ( "phill", obj.string_holder().string );
  EXPECT_EQ( 51, obj.long_value() );
  
  obj2.getStringValue2Test() = "matt";
  obj.string_holder2 = obj2.string_value;
  EXPECT_EQ( "matt", obj.string_holder().string );
  
  obj2.getStringValue2Test() = "sam";
  obj.string_holder3 = obj2.string_value;
  EXPECT_EQ( "sam", obj.string_holder().string );
}